

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O0

void set_multi_layer_params
               (TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,GF_GROUP *gf_group,
               PRIMARY_RATE_CONTROL *p_rc,RATE_CONTROL *rc,FRAME_INFO *frame_info,int start,int end,
               int *cur_frame_idx,int *frame_ind,int *parallel_frame_count,int max_parallel_frames,
               int do_frame_parallel_encode,int *first_frame_index,int *cur_disp_idx,int layer_depth
               )

{
  int iVar1;
  int iVar2;
  int iVar3;
  GF_GROUP *in_RCX;
  GF_GROUP *in_RDX;
  TWO_PASS *in_RSI;
  PRIMARY_RATE_CONTROL *in_R8;
  RATE_CONTROL *in_R9;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  FRAME_INFO *in_stack_00000018;
  PRIMARY_RATE_CONTROL *in_stack_00000020;
  int in_stack_00000028;
  undefined4 in_stack_0000002c;
  int in_stack_00000030;
  undefined4 in_stack_00000034;
  int in_stack_00000038;
  undefined4 in_stack_0000003c;
  int in_stack_00000040;
  undefined4 in_stack_00000044;
  int in_stack_00000048;
  undefined4 in_stack_0000004c;
  int in_stack_00000050;
  undefined4 in_stack_00000054;
  int in_stack_00000058;
  int m;
  int num_frames_to_process;
  int local_6c;
  
  iVar1 = in_stack_00000010 - in_stack_00000008;
  if ((in_RDX->max_layer_depth_allowed < in_stack_00000050) || (iVar1 < 3)) {
    for (; in_stack_00000008 < in_stack_00000010; in_stack_00000008 = in_stack_00000008 + 1) {
      in_RDX->update_type[(int)in_stack_00000020->gf_group_bits] = '\x01';
      in_RDX->arf_src_offset[(int)in_stack_00000020->gf_group_bits] = '\0';
      in_RDX->cur_frame_idx[(int)in_stack_00000020->gf_group_bits] =
           (uchar)in_stack_00000018->frame_width;
      in_RDX->display_idx[(int)in_stack_00000020->gf_group_bits] =
           *(int *)CONCAT44(in_stack_0000004c,in_stack_00000048);
      in_RDX->layer_depth[(int)in_stack_00000020->gf_group_bits] = 6;
      iVar1 = av1_calc_arf_boost((TWO_PASS *)CONCAT44(in_stack_00000034,in_stack_00000030),
                                 (TWO_PASS_FRAME *)CONCAT44(in_stack_0000002c,in_stack_00000028),
                                 in_stack_00000020,in_stack_00000018,in_stack_00000014,
                                 in_stack_00000010,in_stack_00000040,
                                 (int *)CONCAT44(in_stack_0000004c,in_stack_00000048),
                                 (int *)CONCAT44(in_stack_00000054,in_stack_00000050),
                                 in_stack_00000058);
      in_RDX->arf_boost[(int)in_stack_00000020->gf_group_bits] = iVar1;
      in_RDX->frame_type[(int)in_stack_00000020->gf_group_bits] = '\x01';
      in_RDX->refbuf_state[(int)in_stack_00000020->gf_group_bits] = '\x01';
      if (in_stack_00000050 < in_RDX->max_layer_depth) {
        local_6c = in_RDX->max_layer_depth;
      }
      else {
        local_6c = in_stack_00000050;
      }
      in_RDX->max_layer_depth = local_6c;
      if (in_stack_00000038 != 0) {
        set_frame_parallel_level
                  (in_RDX->frame_parallel_level + (int)in_stack_00000020->gf_group_bits,
                   (int *)CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000030);
        in_RDX->is_frame_non_ref[(int)in_stack_00000020->gf_group_bits] = true;
      }
      set_src_offset(in_RDX,(int *)CONCAT44(in_stack_00000044,in_stack_00000040),
                     in_stack_00000018->frame_width,(int)in_stack_00000020->gf_group_bits);
      *(int *)&in_stack_00000020->gf_group_bits = (int)in_stack_00000020->gf_group_bits + 1;
      in_stack_00000018->frame_width = in_stack_00000018->frame_width + 1;
      *(int *)CONCAT44(in_stack_0000004c,in_stack_00000048) =
           *(int *)CONCAT44(in_stack_0000004c,in_stack_00000048) + 1;
    }
  }
  else {
    iVar2 = (in_stack_00000008 + in_stack_00000010 + -1) / 2;
    in_RDX->update_type[(int)in_stack_00000020->gf_group_bits] = '\x06';
    in_RDX->arf_src_offset[(int)in_stack_00000020->gf_group_bits] =
         (char)iVar2 - (char)in_stack_00000008;
    in_RDX->cur_frame_idx[(int)in_stack_00000020->gf_group_bits] =
         (uchar)in_stack_00000018->frame_width;
    in_RDX->display_idx[(int)in_stack_00000020->gf_group_bits] =
         *(int *)CONCAT44(in_stack_0000004c,in_stack_00000048) +
         (uint)in_RDX->arf_src_offset[(int)in_stack_00000020->gf_group_bits];
    in_RDX->layer_depth[(int)in_stack_00000020->gf_group_bits] = in_stack_00000050;
    in_RDX->frame_type[(int)in_stack_00000020->gf_group_bits] = '\x01';
    in_RDX->refbuf_state[(int)in_stack_00000020->gf_group_bits] = '\x01';
    if (((in_stack_00000038 != 0) && (1 < *(int *)CONCAT44(in_stack_0000002c,in_stack_00000028))) &&
       (*(int *)CONCAT44(in_stack_0000002c,in_stack_00000028) <= in_stack_00000030)) {
      if (in_RDX->arf_src_offset[(int)in_stack_00000020->gf_group_bits] < 7) {
        in_RDX->frame_parallel_level[(int)in_stack_00000020->gf_group_bits] = 2;
      }
      *(undefined4 *)CONCAT44(in_stack_0000002c,in_stack_00000028) = 1;
    }
    set_src_offset(in_RDX,(int *)CONCAT44(in_stack_00000044,in_stack_00000040),
                   in_stack_00000018->frame_width,(int)in_stack_00000020->gf_group_bits);
    iVar3 = av1_calc_arf_boost((TWO_PASS *)CONCAT44(in_stack_00000034,in_stack_00000030),
                               (TWO_PASS_FRAME *)CONCAT44(in_stack_0000002c,in_stack_00000028),
                               in_stack_00000020,in_stack_00000018,in_stack_00000014,
                               in_stack_00000010,in_stack_00000040,
                               (int *)CONCAT44(in_stack_0000004c,in_stack_00000048),
                               (int *)CONCAT44(in_stack_00000054,in_stack_00000050),
                               in_stack_00000058);
    in_RDX->arf_boost[(int)in_stack_00000020->gf_group_bits] = iVar3;
    *(int *)&in_stack_00000020->gf_group_bits = (int)in_stack_00000020->gf_group_bits + 1;
    set_multi_layer_params
              (in_RSI,(TWO_PASS_FRAME *)in_RDX,in_RCX,in_R8,in_R9,
               (FRAME_INFO *)CONCAT44(iVar1,iVar2),unaff_retaddr,in_stack_00000008,
               (int *)CONCAT44(in_stack_00000014,in_stack_00000010),&in_stack_00000018->frame_width,
               (int *)in_stack_00000020,in_stack_00000028,in_stack_00000030,
               (int *)CONCAT44(in_stack_0000003c,in_stack_00000038),
               (int *)CONCAT44(in_stack_00000044,in_stack_00000040),in_stack_00000048);
    in_RDX->update_type[(int)in_stack_00000020->gf_group_bits] = '\x05';
    in_RDX->arf_src_offset[(int)in_stack_00000020->gf_group_bits] = '\0';
    in_RDX->cur_frame_idx[(int)in_stack_00000020->gf_group_bits] =
         (uchar)in_stack_00000018->frame_width;
    in_RDX->display_idx[(int)in_stack_00000020->gf_group_bits] =
         *(int *)CONCAT44(in_stack_0000004c,in_stack_00000048);
    in_RDX->arf_boost[(int)in_stack_00000020->gf_group_bits] = 0;
    in_RDX->layer_depth[(int)in_stack_00000020->gf_group_bits] = in_stack_00000050;
    in_RDX->frame_type[(int)in_stack_00000020->gf_group_bits] = '\x01';
    in_RDX->refbuf_state[(int)in_stack_00000020->gf_group_bits] = '\x01';
    set_src_offset(in_RDX,(int *)CONCAT44(in_stack_00000044,in_stack_00000040),
                   in_stack_00000018->frame_width,(int)in_stack_00000020->gf_group_bits);
    *(int *)&in_stack_00000020->gf_group_bits = (int)in_stack_00000020->gf_group_bits + 1;
    in_stack_00000018->frame_width = in_stack_00000018->frame_width + 1;
    *(int *)CONCAT44(in_stack_0000004c,in_stack_00000048) =
         *(int *)CONCAT44(in_stack_0000004c,in_stack_00000048) + 1;
    set_multi_layer_params
              (in_RSI,(TWO_PASS_FRAME *)in_RDX,in_RCX,in_R8,in_R9,
               (FRAME_INFO *)CONCAT44(iVar1,iVar2),unaff_retaddr,in_stack_00000008,
               (int *)CONCAT44(in_stack_00000014,in_stack_00000010),&in_stack_00000018->frame_width,
               (int *)in_stack_00000020,in_stack_00000028,in_stack_00000030,
               (int *)CONCAT44(in_stack_0000003c,in_stack_00000038),
               (int *)CONCAT44(in_stack_00000044,in_stack_00000040),in_stack_00000048);
  }
  return;
}

Assistant:

static void set_multi_layer_params(
    const TWO_PASS *twopass, const TWO_PASS_FRAME *twopass_frame,
    GF_GROUP *const gf_group, const PRIMARY_RATE_CONTROL *p_rc,
    RATE_CONTROL *rc, FRAME_INFO *frame_info, int start, int end,
    int *cur_frame_idx, int *frame_ind, int *parallel_frame_count,
    int max_parallel_frames, int do_frame_parallel_encode,
    int *first_frame_index, int *cur_disp_idx, int layer_depth) {
  const int num_frames_to_process = end - start;

  // Either we are at the last level of the pyramid, or we don't have enough
  // frames between 'l' and 'r' to create one more level.
  if (layer_depth > gf_group->max_layer_depth_allowed ||
      num_frames_to_process < 3) {
    // Leaf nodes.
    while (start < end) {
      gf_group->update_type[*frame_ind] = LF_UPDATE;
      gf_group->arf_src_offset[*frame_ind] = 0;
      gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
      gf_group->display_idx[*frame_ind] = *cur_disp_idx;
      gf_group->layer_depth[*frame_ind] = MAX_ARF_LAYERS;
      gf_group->arf_boost[*frame_ind] =
          av1_calc_arf_boost(twopass, twopass_frame, p_rc, frame_info, start,
                             end - start, 0, NULL, NULL, 0);
      gf_group->frame_type[*frame_ind] = INTER_FRAME;
      gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;
      gf_group->max_layer_depth =
          AOMMAX(gf_group->max_layer_depth, layer_depth);
      // Set the level of parallelism for the LF_UPDATE frame.
      if (do_frame_parallel_encode) {
        set_frame_parallel_level(&gf_group->frame_parallel_level[*frame_ind],
                                 parallel_frame_count, max_parallel_frames);
        // Set LF_UPDATE frames as non-reference frames.
        gf_group->is_frame_non_ref[*frame_ind] = true;
      }
      set_src_offset(gf_group, first_frame_index, *cur_frame_idx, *frame_ind);
      ++(*frame_ind);
      ++(*cur_frame_idx);
      ++(*cur_disp_idx);
      ++start;
    }
  } else {
    const int m = (start + end - 1) / 2;

    // Internal ARF.
    gf_group->update_type[*frame_ind] = INTNL_ARF_UPDATE;
    gf_group->arf_src_offset[*frame_ind] = m - start;
    gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
    gf_group->display_idx[*frame_ind] =
        *cur_disp_idx + gf_group->arf_src_offset[*frame_ind];
    gf_group->layer_depth[*frame_ind] = layer_depth;
    gf_group->frame_type[*frame_ind] = INTER_FRAME;
    gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;

    if (do_frame_parallel_encode) {
      // If max_parallel_frames is not exceeded and if the frame will not be
      // temporally filtered, encode the next internal ARF frame in parallel.
      if (*parallel_frame_count > 1 &&
          *parallel_frame_count <= max_parallel_frames) {
        if (gf_group->arf_src_offset[*frame_ind] < TF_LOOKAHEAD_IDX_THR)
          gf_group->frame_parallel_level[*frame_ind] = 2;
        *parallel_frame_count = 1;
      }
    }
    set_src_offset(gf_group, first_frame_index, *cur_frame_idx, *frame_ind);

    // Get the boost factor for intermediate ARF frames.
    gf_group->arf_boost[*frame_ind] =
        av1_calc_arf_boost(twopass, twopass_frame, p_rc, frame_info, m, end - m,
                           m - start, NULL, NULL, 0);
    ++(*frame_ind);

    // Frames displayed before this internal ARF.
    set_multi_layer_params(twopass, twopass_frame, gf_group, p_rc, rc,
                           frame_info, start, m, cur_frame_idx, frame_ind,
                           parallel_frame_count, max_parallel_frames,
                           do_frame_parallel_encode, first_frame_index,
                           cur_disp_idx, layer_depth + 1);

    // Overlay for internal ARF.
    gf_group->update_type[*frame_ind] = INTNL_OVERLAY_UPDATE;
    gf_group->arf_src_offset[*frame_ind] = 0;
    gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
    gf_group->display_idx[*frame_ind] = *cur_disp_idx;
    gf_group->arf_boost[*frame_ind] = 0;
    gf_group->layer_depth[*frame_ind] = layer_depth;
    gf_group->frame_type[*frame_ind] = INTER_FRAME;
    gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;

    set_src_offset(gf_group, first_frame_index, *cur_frame_idx, *frame_ind);
    ++(*frame_ind);
    ++(*cur_frame_idx);
    ++(*cur_disp_idx);

    // Frames displayed after this internal ARF.
    set_multi_layer_params(twopass, twopass_frame, gf_group, p_rc, rc,
                           frame_info, m + 1, end, cur_frame_idx, frame_ind,
                           parallel_frame_count, max_parallel_frames,
                           do_frame_parallel_encode, first_frame_index,
                           cur_disp_idx, layer_depth + 1);
  }
}